

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_back_compat_test_common.c
# Opt level: O0

_Bool check_iothub_result(IOTHUB_CLIENT_RESULT iothub_result)

{
  _Bool result;
  IOTHUB_CLIENT_RESULT iothub_result_local;
  
  return iothub_result == IOTHUB_CLIENT_OK;
}

Assistant:

static bool check_iothub_result(IOTHUB_CLIENT_RESULT iothub_result)
{
    bool result;
    switch (iothub_result)
    {
        case IOTHUB_CLIENT_OK:
            result = true;
            break;
        case IOTHUB_CLIENT_INVALID_ARG:
        case IOTHUB_CLIENT_ERROR:
        case IOTHUB_CLIENT_INVALID_SIZE:
        case IOTHUB_CLIENT_INDEFINITE_TIME:
        default:
            result = false;
            break;
    }
    return result;
}